

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceln.cpp
# Opt level: O3

void embree::AccelN::intersect4
               (void *valid,Intersectors *This_in,RTCRayHit4 *ray,RayQueryContext *context)

{
  AccelData *pAVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  pAVar1 = This_in->ptr;
  lVar3 = *(long *)&pAVar1[3].type;
  lVar4 = *(long *)&pAVar1[3].field_0x58;
  if (lVar4 != lVar3) {
    uVar5 = 0;
    do {
      lVar2 = *(long *)(lVar3 + uVar5 * 8);
      if (*(float *)(lVar2 + 0x10) < INFINITY) {
        (**(code **)(lVar2 + 0x98))(valid,lVar2 + 0x58,ray,context);
        lVar3 = *(long *)&pAVar1[3].type;
        lVar4 = *(long *)&pAVar1[3].field_0x58;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(lVar4 - lVar3 >> 3));
  }
  return;
}

Assistant:

void AccelN::intersect4 (const void* valid, Accel::Intersectors* This_in, RTCRayHit4& ray, RayQueryContext* context) 
  {
    AccelN* This = (AccelN*)This_in->ptr;
    for (size_t i=0; i<This->accels.size(); i++)
      if (!This->accels[i]->isEmpty())
        This->accels[i]->intersectors.intersect4(valid,ray,context);
  }